

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O3

void Gia_ManUnrollDup_rec(Gia_Man_t *pNew,Gia_Obj_t *pObj,int Id)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  
  if (pObj->Value == 0xffffffff) {
    uVar2 = (uint)*(ulong *)pObj;
    if ((uVar2 & 0x9fffffff) == 0x9fffffff) {
      pGVar3 = Gia_ManAppendObj(pNew);
      uVar4 = *(ulong *)pGVar3;
      *(ulong *)pGVar3 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar3 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar1 = pNew->pObjs;
      if ((pGVar3 < pGVar1) || (pGVar1 + pNew->nObjs <= pGVar3)) {
LAB_00711a88:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar3 - (long)pGVar1) >> 2) * -0x55555555);
      pGVar1 = pNew->pObjs;
      if ((pGVar3 < pGVar1) || (pGVar1 + pNew->nObjs <= pGVar3)) goto LAB_00711a88;
      uVar2 = (int)((ulong)((long)pGVar3 - (long)pGVar1) >> 2) * 0x55555556;
    }
    else {
      uVar4 = *(ulong *)pObj & 0x1fffffff;
      if (uVar4 == 0x1fffffff || -1 < (int)uVar2) {
        if (((int)uVar2 < 0) || ((int)uVar4 == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaFrames.c"
                        ,0x5c,"void Gia_ManUnrollDup_rec(Gia_Man_t *, Gia_Obj_t *, int)");
        }
        Gia_ManUnrollDup_rec(pNew,pObj + -uVar4,Id - (uVar2 & 0x1fffffff));
        Gia_ManUnrollDup_rec
                  (pNew,pObj + -(*(ulong *)pObj >> 0x20 & 0x1fffffff),
                   Id - ((uint)(*(ulong *)pObj >> 0x20) & 0x1fffffff));
        uVar4 = *(ulong *)pObj;
        if (((int)pObj[-(uVar4 & 0x1fffffff)].Value < 0) ||
           (uVar2 = (uint)(uVar4 >> 0x20), (int)pObj[-(ulong)(uVar2 & 0x1fffffff)].Value < 0))
        goto LAB_00711ae5;
        uVar2 = Gia_ManAppendAnd(pNew,(uint)(uVar4 >> 0x1d) & 1 ^ pObj[-(uVar4 & 0x1fffffff)].Value,
                                 pObj[-(ulong)(uVar2 & 0x1fffffff)].Value ^ uVar2 >> 0x1d & 1);
      }
      else {
        Gia_ManUnrollDup_rec(pNew,pObj + -uVar4,Id - (uVar2 & 0x1fffffff));
        if ((int)pObj[-(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff)].Value < 0) {
LAB_00711ae5:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar2 = Gia_ManAppendCo(pNew,(uint)*(undefined8 *)pObj >> 0x1d & 1 ^
                                     pObj[-(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff)].Value);
      }
    }
    pObj->Value = uVar2;
    if ((int)uVar2 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (pNew->nObjs <= (int)(uVar2 >> 1)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pNew->pObjs[uVar2 >> 1].Value = Id;
  }
  return;
}

Assistant:

void Gia_ManUnrollDup_rec( Gia_Man_t * pNew, Gia_Obj_t * pObj, int Id ) 
{
    if ( ~pObj->Value )
        return;
    if ( Gia_ObjIsCi(pObj) )
        pObj->Value = Gia_ManAppendCi(pNew);
    else if ( Gia_ObjIsCo(pObj) )
    {
        Gia_ManUnrollDup_rec( pNew, Gia_ObjFanin0(pObj), Gia_ObjFaninId0(pObj, Id) );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    else if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManUnrollDup_rec( pNew, Gia_ObjFanin0(pObj), Gia_ObjFaninId0(pObj, Id) );
        Gia_ManUnrollDup_rec( pNew, Gia_ObjFanin1(pObj), Gia_ObjFaninId1(pObj, Id) );
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    else assert( 0 );
    Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value))->Value = Id;
}